

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gherkin_line.c
# Opt level: O2

wchar_t * find_cell_delimiter(wchar_t *start_pos)

{
  wchar_t wVar1;
  wchar_t *current_pos;
  
  do {
    wVar1 = *start_pos;
    if (wVar1 == L'\\') {
      start_pos = start_pos + 1;
    }
    else {
      if (wVar1 == L'\0') {
        return (wchar_t *)0x0;
      }
      if (wVar1 == L'|') {
        return start_pos;
      }
    }
    start_pos = start_pos + 1;
  } while( true );
}

Assistant:

static const wchar_t* find_cell_delimiter(const wchar_t* start_pos) {
    const wchar_t* current_pos = start_pos;
    while (*current_pos != L'\0') {
        if (*current_pos == L'|')
            return current_pos;
        if (*current_pos == L'\\')
            ++current_pos;
        ++current_pos;
    }
    return 0;
}